

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_snd_static.cxx
# Opt level: O2

void __thiscall
write_sound_src::operator()(write_sound_src *this,sound_src_data *sound_src,xr_writer *w)

{
  float local_20;
  float local_1c;
  
  xray_re::xr_writer::open_chunk(w,0);
  xray_re::xr_writer::w_sz(w,&sound_src->name);
  xray_re::xr_writer::w_fvector3(w,&sound_src->position);
  local_20 = sound_src->volume;
  (*w->_vptr_xr_writer[2])(w,&local_20,4);
  local_1c = sound_src->freq;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  xray_re::xr_writer::w_i32vector2(w,&sound_src->active_time);
  xray_re::xr_writer::w_i32vector2(w,&sound_src->play_time);
  xray_re::xr_writer::w_i32vector2(w,&sound_src->pause_time);
  return;
}

Assistant:

void operator()(const sound_src_data* sound_src, xr_writer& w) const {
	w.open_chunk(0);
	w.w_sz(sound_src->name);
	w.w_fvector3(sound_src->position);
	w.w_float(sound_src->volume);
	w.w_float(sound_src->freq);
	w.w_i32vector2(sound_src->active_time);
	w.w_i32vector2(sound_src->play_time);
	w.w_i32vector2(sound_src->pause_time);
}